

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *type_names,Index binding_index_offset)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  char *pcVar4;
  string *__args_1;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar5;
  Type local_128;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_120;
  undefined1 local_118;
  unsigned_long local_110;
  Type local_108;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_100;
  Binding local_f8;
  int local_d0;
  Enum local_cc;
  undefined1 local_c8 [8];
  Location loc;
  Var type;
  string name;
  Index binding_index_offset_local;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *type_names_local;
  BindingHash *bindings_local;
  TypeVector *types_local;
  TokenType token_local;
  WastParser *this_local;
  
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    bVar1 = PeekMatch(this,Last_String,0);
    if (bVar1) {
      std::__cxx11::string::string((string *)((long)&type.field_2 + 0x18));
      Var::Var((Var *)((long)&loc.field_1 + 8));
      GetLocation((Location *)local_c8,this);
      ParseBindVarOpt(this,(string *)((long)&type.field_2 + 0x18));
      local_cc = (Enum)ParseValueType(this,(Var *)((long)&loc.field_1 + 8));
      bVar1 = Failed((Result)local_cc);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_d0 = 1;
      }
      else {
        sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
        Binding::Binding(&local_f8,(Location *)local_c8,binding_index_offset + (int)sVar3);
        __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type.field_2 + 0x18);
        local_100._M_cur =
             (__node_type *)
             std::
             unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
             ::emplace<std::__cxx11::string&,wabt::Binding>
                       ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                         *)bindings,__args,&local_f8);
        bVar1 = Var::is_index((Var *)((long)&loc.field_1 + 8));
        if (bVar1) {
          pcVar4 = Var::index((Var *)((long)&loc.field_1 + 8),(char *)__args,__c);
          Type::Type(&local_108,(int32_t)pcVar4);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(types,&local_108);
        }
        else {
          bVar1 = Var::is_name((Var *)((long)&loc.field_1 + 8));
          if (!bVar1) {
            __assert_fail("type.is_name()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0x748,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, std::unordered_map<uint32_t, std::string> *, Index)"
                         );
          }
          bVar1 = Features::function_references_enabled(&this->options_->features);
          if (!bVar1) {
            __assert_fail("options_->features.function_references_enabled()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0x749,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, std::unordered_map<uint32_t, std::string> *, Index)"
                         );
          }
          sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
          local_110 = binding_index_offset + sVar3;
          __args_1 = Var::name_abi_cxx11_((Var *)((long)&loc.field_1 + 8));
          pVar5 = std::
                  unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                  ::emplace<unsigned_long,std::__cxx11::string_const&>
                            ((unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                              *)type_names,&local_110,__args_1);
          local_120._M_cur =
               (__node_type *)
               pVar5.first.
               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               ._M_cur;
          local_118 = pVar5.second;
          Type::Type(&local_128,Reference,0xffffffff);
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back(types,&local_128);
        }
        local_d0 = 0;
      }
      Var::~Var((Var *)((long)&loc.field_1 + 8));
      std::__cxx11::string::~string((string *)((long)&type.field_2 + 0x18));
      if (local_d0 != 0) {
        return (Result)this_local._4_4_;
      }
    }
    else {
      RVar2 = ParseValueTypeList(this,types,type_names);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseBoundValueTypeList(
    TokenType token,
    TypeVector* types,
    BindingHash* bindings,
    std::unordered_map<uint32_t, std::string>* type_names,
    Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Var type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      if (type.is_index()) {
        types->push_back(Type(type.index()));
      } else {
        assert(type.is_name());
        assert(options_->features.function_references_enabled());
        type_names->emplace(binding_index_offset + types->size(), type.name());
        types->push_back(Type(Type::Reference, kInvalidIndex));
      }
    } else {
      CHECK_RESULT(ParseValueTypeList(types, type_names));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}